

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# instruction_sets.h
# Opt level: O0

TargetBits
highwayhash::InstructionSets::
RunAll<highwayhash::HighwayHashCatTest,_const_unsigned_long_(&)[4],_char_(&)[105],_const_unsigned_int_&,_unsigned_long_(*)[2],_void_(*)(const_char_*,_unsigned_long)>
          (unsigned_long (*args) [4],char (*args_1) [105],uint *args_2,unsigned_long (**args_3) [2],
          _func_void_char_ptr_unsigned_long **args_4)

{
  HighwayHashCatTest<1U> local_37;
  HighwayHashCatTest<2U> local_36;
  HighwayHashCatTest<4U> local_35;
  TargetBits local_34;
  _func_void_char_ptr_unsigned_long **pp_Stack_30;
  TargetBits supported;
  _func_void_char_ptr_unsigned_long **args_local_4;
  unsigned_long (**args_local_3) [2];
  uint *args_local_2;
  char (*args_local_1) [105];
  unsigned_long (*args_local) [4];
  
  pp_Stack_30 = args_4;
  args_local_4 = (_func_void_char_ptr_unsigned_long **)args_3;
  args_local_3 = (unsigned_long (**) [2])args_2;
  args_local_2 = (uint *)args_1;
  args_local_1 = (char (*) [105])args;
  local_34 = Supported();
  if ((local_34 & 4) != 0) {
    HighwayHashCatTest<4U>::operator()
              (&local_35,(HHKey *)args_local_1,(char *)args_local_2,(ulong)*(uint *)args_local_3,
               (HHResult128 *)*args_local_4,(HHNotify)*pp_Stack_30);
  }
  if ((local_34 & 2) != 0) {
    HighwayHashCatTest<2U>::operator()
              (&local_36,(HHKey *)args_local_1,(char *)args_local_2,(ulong)*(uint *)args_local_3,
               (HHResult128 *)*args_local_4,(HHNotify)*pp_Stack_30);
  }
  HighwayHashCatTest<1U>::operator()
            (&local_37,(HHKey *)args_local_1,(char *)args_local_2,(ulong)*(uint *)args_local_3,
             (HHResult128 *)*args_local_4,(HHNotify)*pp_Stack_30);
  return local_34;
}

Assistant:

static HH_INLINE TargetBits RunAll(Args&&... args) {
    const TargetBits supported = Supported();

#if HH_ARCH_X64
    if (supported & HH_TARGET_AVX2) {
      Func<HH_TARGET_AVX2>()(std::forward<Args>(args)...);
    }
    if (supported & HH_TARGET_SSE41) {
      Func<HH_TARGET_SSE41>()(std::forward<Args>(args)...);
    }
#elif HH_ARCH_PPC
    if (supported & HH_TARGET_VSX) {
      Func<HH_TARGET_VSX>()(std::forward<Args>(args)...);
    }

#elif HH_ARCH_NEON
    if (supported & HH_TARGET_NEON) {
      Func<HH_TARGET_NEON>()(std::forward<Args>(args)...);
    }
#endif

    Func<HH_TARGET_Portable>()(std::forward<Args>(args)...);

    return supported;  // i.e. all that were run
  }